

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon_triangulation.cc
# Opt level: O1

void PolygonTriangulation::Triangulate
               (size_t num_contours,uint32_t *nvertices_per_contour,vertex_t *vertices,
               TriangleBuffer_t *triangles)

{
  PolygonTriangulation tri;
  PolygonTriangulation PStack_e8;
  
  if (num_contours == 0) {
    __assert_fail("0u != num_contours",
                  "/workspace/llm4binary/github/license_c_cmakelists/tcoppex[P]polytri/src/polygon_triangulation.cc"
                  ,0xe,
                  "static void PolygonTriangulation::Triangulate(const size_t, const uint32_t *, const vertex_t *, TriangleBuffer_t &)"
                 );
  }
  if (nvertices_per_contour != (uint32_t *)0x0) {
    if (vertices != (vertex_t *)0x0) {
      PolygonTriangulation(&PStack_e8,num_contours,nvertices_per_contour,vertices);
      trapezoidal_decomposition(&PStack_e8);
      monotone_partitioning(&PStack_e8);
      triangulate_monotone_polygons(&PStack_e8,triangles);
      ~PolygonTriangulation(&PStack_e8);
      return;
    }
    __assert_fail("nullptr != vertices",
                  "/workspace/llm4binary/github/license_c_cmakelists/tcoppex[P]polytri/src/polygon_triangulation.cc"
                  ,0x10,
                  "static void PolygonTriangulation::Triangulate(const size_t, const uint32_t *, const vertex_t *, TriangleBuffer_t &)"
                 );
  }
  __assert_fail("nullptr != nvertices_per_contour",
                "/workspace/llm4binary/github/license_c_cmakelists/tcoppex[P]polytri/src/polygon_triangulation.cc"
                ,0xf,
                "static void PolygonTriangulation::Triangulate(const size_t, const uint32_t *, const vertex_t *, TriangleBuffer_t &)"
               );
}

Assistant:

void PolygonTriangulation::Triangulate(const size_t num_contours,
                                       const uint32_t nvertices_per_contour[],
                                       const vertex_t vertices[],
                                       TriangleBuffer_t &triangles)
{
  assert(0u != num_contours);
  assert(nullptr != nvertices_per_contour);
  assert(nullptr != vertices);

  PolygonTriangulation tri(num_contours, nvertices_per_contour, vertices);
  tri.trapezoidal_decomposition();
  tri.monotone_partitioning();
  tri.triangulate_monotone_polygons(triangles);
}